

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O1

basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> * __thiscall
RandomTestData<char32_t,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
::get_remainder(basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                *__return_storage_ptr__,
               RandomTestData<char32_t,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
               *this,size_t in_times_split)

{
  pointer pbVar1;
  ulong uVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  pbVar1 = (this->m_tokens).
           super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (in_times_split <
      (ulong)((long)(this->m_tokens).
                    super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5)) {
    uVar2 = in_times_split << 5 | 8;
    do {
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      replace(__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,
              *(char32_t **)((long)pbVar1 + (uVar2 - 8)),
              *(size_type *)((long)&(pbVar1->_M_dataplus)._M_p + uVar2));
      in_times_split = in_times_split + 1;
      if (in_times_split <
          (ulong)((long)(this->m_tokens).
                        super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->m_tokens).
                        super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5)) {
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::replace(__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,
                  (this->m_delim)._M_dataplus._M_p,(this->m_delim)._M_string_length);
      }
      pbVar1 = (this->m_tokens).
               super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar2 = uVar2 + 0x20;
    } while (in_times_split <
             (ulong)((long)(this->m_tokens).
                           super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5));
  }
  return __return_storage_ptr__;
}

Assistant:

StringT get_remainder(size_t in_times_split) {
		StringT result;
		while (in_times_split < m_tokens.size()) {
			auto& token = m_tokens[in_times_split];
			result.insert(result.end(), token.begin(), token.end());
			++in_times_split;
			if (in_times_split < m_tokens.size()) {
				result.insert(result.end(), m_delim.begin(), m_delim.end());
			}
		}

		return result;
	}